

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O1

void __thiscall
rr::FragmentProcessor::executeMaskedColorWrite
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,Vec4 *colorMaskFactor,Vec4 *colorMaskNegationFactor,bool isSRGB,
          PixelBufferAccess *colorBuffer)

{
  Fragment *pFVar1;
  ulong uVar2;
  int i;
  int iVar3;
  long lVar4;
  ulong uVar5;
  Vec3 *pVVar6;
  Vector<float,_4> res_2;
  Vector<float,_4> res_1;
  Vector<float,_4> res;
  Vec4 originalColor;
  Vec4 local_b8;
  int local_a4;
  int local_a0;
  int local_9c;
  undefined1 *local_98;
  float afStack_90 [6];
  FragmentProcessor *local_78;
  Fragment *local_70;
  float local_68 [10];
  float local_40 [4];
  
  pVVar6 = &this->m_sampleRegister[0].blendedRGB;
  uVar5 = 0;
  local_a4 = fragNdxOffset;
  local_a0 = numSamplesPerFragment;
  local_78 = this;
  local_70 = inputFragments;
  do {
    if (this->m_sampleRegister[uVar5].isAlive == true) {
      uVar2 = (ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff;
      iVar3 = (int)((long)uVar2 / (long)local_a0) + local_a4;
      pFVar1 = local_70 + iVar3;
      local_9c = (int)((long)uVar2 % (long)local_a0);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_40,(int)colorBuffer,local_9c,
                 local_70[iVar3].pixelCoord.m_data[0]);
      local_b8.m_data[0] = 0.0;
      local_b8.m_data[1] = 0.0;
      local_b8.m_data[2] = 0.0;
      local_b8.m_data[3] = 0.0;
      afStack_90[0] = 0.0;
      afStack_90[1] = 1.4013e-45;
      afStack_90[2] = 2.8026e-45;
      lVar4 = 0;
      local_98 = (undefined1 *)&local_b8;
      do {
        local_b8.m_data[(int)afStack_90[lVar4]] = pVVar6->m_data[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      local_b8.m_data[3] = this->m_sampleRegister[uVar5].blendedA;
      if (isSRGB) {
        tcu::linearToSRGB((tcu *)&local_98,&local_b8);
        local_b8.m_data._0_8_ = local_98;
        local_b8.m_data[2] = afStack_90[0];
        local_b8.m_data[3] = afStack_90[1];
      }
      local_68[4] = 0.0;
      local_68[5] = 0.0;
      local_68[6] = 0.0;
      local_68[7] = 0.0;
      lVar4 = 0;
      do {
        local_68[lVar4 + 4] = colorMaskFactor->m_data[lVar4] * local_b8.m_data[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      local_68[0] = 0.0;
      local_68[1] = 0.0;
      local_68[2] = 0.0;
      local_68[3] = 0.0;
      lVar4 = 0;
      do {
        local_68[lVar4] = colorMaskNegationFactor->m_data[lVar4] * local_40[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      local_98 = (undefined1 *)0x0;
      afStack_90[0] = 0.0;
      afStack_90[1] = 0.0;
      lVar4 = 0;
      do {
        *(float *)((long)&local_98 + lVar4 * 4) = local_68[lVar4 + 4] + local_68[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      local_b8.m_data._0_8_ = local_98;
      local_b8.m_data[2] = afStack_90[0];
      local_b8.m_data[3] = afStack_90[1];
      tcu::PixelBufferAccess::setPixel
                (colorBuffer,&local_b8,local_9c,(pFVar1->pixelCoord).m_data[0],
                 (pFVar1->pixelCoord).m_data[1]);
      this = local_78;
    }
    uVar5 = uVar5 + 1;
    pVVar6 = pVVar6 + 0xb;
  } while (uVar5 != 0x40);
  return;
}

Assistant:

void FragmentProcessor::executeMaskedColorWrite (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, const Vec4& colorMaskFactor, const Vec4& colorMaskNegationFactor, bool isSRGB, const tcu::PixelBufferAccess& colorBuffer)
{
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive)
		{
			int					fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
			const Fragment&		frag			= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];
			Vec4				originalColor	= colorBuffer.getPixel(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());
			Vec4				newColor;

			newColor.xyz()	= m_sampleRegister[regSampleNdx].blendedRGB;
			newColor.w()	= m_sampleRegister[regSampleNdx].blendedA;

			if (isSRGB)
				newColor = tcu::linearToSRGB(newColor);

			newColor = colorMaskFactor*newColor + colorMaskNegationFactor*originalColor;

			colorBuffer.setPixel(newColor, fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());
		}
	}
}